

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorMatrix(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         **vec,
                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  uint *puVar1;
  undefined8 *puVar2;
  Col *pCVar3;
  undefined1 uVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar11;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  pointer pnVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  bool bVar22;
  type_conflict5 tVar23;
  ulong uVar24;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar25;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  int iVar26;
  uint uVar27;
  Dring *pDVar28;
  long lVar29;
  Dring *pDVar30;
  int i;
  long lVar31;
  Dring *pDVar32;
  int i_1;
  long lVar33;
  Dring *pDVar34;
  int iVar35;
  int j;
  long lVar36;
  int local_478;
  int local_474;
  long local_410;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  int local_318;
  undefined1 local_314;
  fpclass_type local_310;
  int32_t local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  int local_2c8;
  undefined1 local_2c4;
  fpclass_type local_2c0;
  int32_t local_2bc;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  multiprecision local_218 [8];
  uint auStack_210 [2];
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  uint auStack_1e0 [2];
  int local_1d8;
  undefined1 local_1d4;
  fpclass_type local_1d0;
  int32_t local_1cc;
  multiprecision local_1c8 [8];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  uint auStack_190 [2];
  int local_188;
  undefined1 local_184;
  fpclass_type local_180;
  int32_t local_17c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  piVar8 = (this->temp).s_mark;
  piVar9 = (this->u).row.len;
  piVar10 = (this->u).row.max;
  for (lVar31 = 0; uVar24 = (ulong)this->thedim, lVar31 < (long)uVar24; lVar31 = lVar31 + 1) {
    piVar9[lVar31] = 0;
    piVar10[lVar31] = 0;
  }
  iVar26 = 0;
  for (lVar31 = 0; lVar31 < (int)uVar24; lVar31 = lVar31 + 1) {
    iVar35 = vec[lVar31]->memused;
    if ((long)iVar35 < 2) {
      if (iVar35 == 0) {
        this->stat = SINGULAR;
        return;
      }
    }
    else {
      piVar9 = (this->u).row.max;
      pNVar11 = vec[lVar31]->m_elem;
      for (lVar33 = 0; (long)iVar35 * 0x54 - lVar33 != 0; lVar33 = lVar33 + 0x54) {
        piVar10 = piVar9 + *(int *)((long)(&pNVar11->val + 1) + lVar33);
        *piVar10 = *piVar10 + 1;
      }
      iVar26 = iVar35 + iVar26;
      uVar24 = (ulong)(uint)this->thedim;
    }
  }
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  lVar31 = (long)iVar26;
  local_410 = lVar31;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            (&result.m_backend,&(this->rowMemMult).m_backend,&local_410);
  iVar26 = boost::multiprecision::
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
  minRowMem(this,iVar26);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  local_410 = lVar31;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            (&result.m_backend,&(this->colMemMult).m_backend,&local_410);
  iVar26 = boost::multiprecision::
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
  minColMem(this,iVar26);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  local_410 = lVar31;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            (&result.m_backend,&(this->lMemMult).m_backend,&local_410);
  iVar26 = boost::multiprecision::
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result.m_backend);
  minLMem(this,iVar26);
  piVar9 = (this->u).row.start;
  *piVar9 = 0;
  pDVar34 = (this->u).row.elem;
  iVar26 = this->thedim;
  (this->u).row.list.idx = iVar26;
  (this->u).row.list.next = pDVar34;
  pCVar3 = &(this->u).col;
  pDVar32 = (this->u).col.elem;
  (this->u).col.list.idx = iVar26;
  (this->u).col.list.next = pDVar32;
  piVar10 = (this->u).row.max;
  iVar35 = 0;
  lVar31 = 0;
  pDVar28 = (Dring *)&this->u;
  pDVar30 = &pCVar3->list;
  for (; lVar31 < iVar26; lVar31 = lVar31 + 1) {
    piVar9[lVar31] = iVar35;
    iVar35 = iVar35 + piVar10[lVar31];
    pDVar34->idx = (int)lVar31;
    pDVar34->prev = pDVar28;
    (((Row *)&pDVar28->next)->list).next = pDVar34;
    pDVar32->idx = (int)lVar31;
    pDVar32->prev = pDVar30;
    ((Dring *)&pDVar30->next)->next = pDVar32;
    iVar26 = this->thedim;
    pDVar28 = pDVar34;
    pDVar30 = pDVar32;
    pDVar32 = pDVar32 + 1;
    pDVar34 = pDVar34 + 1;
  }
  piVar9[iVar26] = 0;
  piVar10[this->thedim] = 0;
  (this->u).row.used = iVar35;
  pDVar28->next = (Dring *)&this->u;
  (this->u).row.list.prev = pDVar28;
  pDVar30->next = &pCVar3->list;
  (this->u).col.list.prev = pDVar30;
  (this->temp).stage = 0;
  this_00 = &this->initMaxabs;
  lVar31 = 0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&this_00->m_backend,0);
  local_478 = 0;
  do {
    if (this->thedim <= lVar31) {
      (this->u).col.used = local_478;
      return;
    }
    pSVar12 = vec[lVar31];
    (this->u).col.start[lVar31] = local_478;
    lVar36 = 0;
    lVar33 = 0x48;
    for (uVar27 = 0; (uVar24 = (ulong)pSVar12->memused, lVar36 < (long)uVar24 && (uVar27 < 2));
        uVar27 = uVar27 + bVar22) {
      pNVar11 = pSVar12->m_elem;
      puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar33 + -0x48);
      local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar33 + -0x38);
      local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar33 + -0x28);
      local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar33 + -0x18);
      local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.m_backend.exp = *(int *)((long)(pNVar11->val).m_backend.data._M_elems + lVar33 + -8);
      local_88.m_backend.neg = *(bool *)((long)(pNVar11->val).m_backend.data._M_elems + lVar33 + -4)
      ;
      local_88.m_backend._72_8_ =
           *(undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + lVar33);
      local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
      local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
      local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
      local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10)
      ;
      local_d8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
      local_d8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
      local_d8.m_backend.exp = (eps->m_backend).exp;
      local_d8.m_backend.neg = (eps->m_backend).neg;
      local_d8.m_backend.fpclass = (eps->m_backend).fpclass;
      local_d8.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar22 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_88,&local_d8);
      lVar36 = lVar36 + 1;
      lVar33 = lVar33 + 0x54;
    }
    iVar26 = (int)lVar31;
    if (uVar27 == 1) {
      lVar33 = -4;
      do {
        lVar36 = lVar33;
        pNVar11 = pSVar12->m_elem;
        puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 4);
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x14);
        local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x24);
        local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x34);
        local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_128.m_backend.exp = *(int *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36 + 4);
        local_128.m_backend.neg = *(bool *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36 + 8)
        ;
        local_128.m_backend._72_8_ =
             *(undefined8 *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36 + 0xc);
        local_3a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_3a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_3a8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_3a8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_3a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_3a8.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_3a8.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_3a8.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_3a8.m_backend.exp = (eps->m_backend).exp;
        local_3a8.m_backend.neg = (eps->m_backend).neg;
        local_3a8.m_backend.fpclass = (eps->m_backend).fpclass;
        local_3a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar22 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_128,&local_3a8);
        lVar33 = lVar36 + 0x54;
      } while (bVar22);
      pNVar11 = pSVar12->m_elem;
      pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(long)*(int *)((long)pNVar11[1].val.m_backend.data._M_elems + lVar36);
      if (-1 < (this->row).perm[(long)pnVar25]) goto LAB_003100d7;
      puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 4);
      uVar14 = *(undefined8 *)puVar1;
      uVar15 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x14);
      uVar16 = *(undefined8 *)puVar1;
      uVar17 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x24);
      uVar18 = *(undefined8 *)puVar1;
      uVar19 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x34);
      uVar20 = *(undefined8 *)puVar1;
      uVar21 = *(undefined8 *)(puVar1 + 2);
      iVar35 = *(int *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36 + 4);
      uVar4 = *(undefined1 *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36 + 8);
      fVar5 = *(fpclass_type *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36 + 0xc);
      iVar6 = *(int32_t *)((long)(&pNVar11->val + 1) + lVar36);
      local_1c8 = (multiprecision  [8])uVar14;
      auStack_1c0 = (uint  [2])uVar15;
      local_1b8 = (uint  [2])uVar16;
      auStack_1b0 = (uint  [2])uVar17;
      local_1a8 = (uint  [2])uVar18;
      auStack_1a0 = (uint  [2])uVar19;
      local_198 = (uint  [2])uVar20;
      auStack_190 = (uint  [2])uVar21;
      local_188 = iVar35;
      local_184 = uVar4;
      local_180 = fVar5;
      local_17c = iVar6;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result,local_1c8,pnVar25);
      tVar23 = boost::multiprecision::operator>(&result,this_00);
      if (tVar23) {
        local_218 = (multiprecision  [8])uVar14;
        auStack_210 = (uint  [2])uVar15;
        local_208 = (uint  [2])uVar16;
        auStack_200 = (uint  [2])uVar17;
        local_1f8 = (uint  [2])uVar18;
        auStack_1f0 = (uint  [2])uVar19;
        local_1e8 = (uint  [2])uVar20;
        auStack_1e0 = (uint  [2])uVar21;
        local_1d8 = iVar35;
        local_1d4 = uVar4;
        local_1d0 = fVar5;
        local_1cc = iVar6;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result,local_218,arg_00);
        *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 0xc) =
             result.m_backend.data._M_elems._48_8_;
        *(ulong *)((this->initMaxabs).m_backend.data._M_elems + 0xe) =
             CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,
                      result.m_backend.data._M_elems._56_5_);
        *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 8) =
             result.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 10) =
             result.m_backend.data._M_elems._40_8_;
        *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 4) =
             result.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 6) =
             result.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(this_00->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 2) =
             result.m_backend.data._M_elems._8_8_;
        (this->initMaxabs).m_backend.exp = result.m_backend.exp;
        (this->initMaxabs).m_backend.neg = result.m_backend.neg;
        (this->initMaxabs).m_backend.fpclass = result.m_backend.fpclass;
        (this->initMaxabs).m_backend.prec_elem = result.m_backend.prec_elem;
      }
      local_268.m_backend.data._M_elems._0_8_ = uVar14;
      local_268.m_backend.data._M_elems._8_8_ = uVar15;
      local_268.m_backend.data._M_elems._16_8_ = uVar16;
      local_268.m_backend.data._M_elems._24_8_ = uVar17;
      local_268.m_backend.data._M_elems._32_8_ = uVar18;
      local_268.m_backend.data._M_elems._40_8_ = uVar19;
      local_268.m_backend.data._M_elems._48_8_ = uVar20;
      local_268.m_backend.data._M_elems._56_8_ = uVar21;
      local_268.m_backend.exp = iVar35;
      local_268.m_backend.neg = (bool)uVar4;
      local_268.m_backend.fpclass = fVar5;
      local_268.m_backend.prec_elem = iVar6;
      setPivot(this,(this->temp).stage,iVar26,
               *(int *)((long)pSVar12->m_elem[1].val.m_backend.data._M_elems + lVar36),&local_268);
      piVar8[(this->temp).stage] = iVar26;
      piVar9 = &(this->temp).stage;
      *piVar9 = *piVar9 + 1;
      local_474 = 0;
    }
    else {
      if (uVar27 == 0) {
LAB_003100d7:
        this->stat = SINGULAR;
        return;
      }
      lVar36 = 0;
      local_474 = 0;
      for (lVar33 = 0; lVar33 < (int)uVar24; lVar33 = lVar33 + 1) {
        pNVar11 = pSVar12->m_elem;
        puVar2 = (undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36);
        uVar14 = *puVar2;
        uVar15 = puVar2[1];
        puVar2 = (undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x10);
        uVar16 = *puVar2;
        uVar17 = puVar2[1];
        puVar2 = (undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x20);
        uVar18 = *puVar2;
        uVar19 = puVar2[1];
        puVar2 = (undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x30);
        uVar20 = *puVar2;
        uVar21 = puVar2[1];
        iVar35 = *(int *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36);
        uVar4 = *(undefined1 *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36 + 4);
        fVar5 = *(fpclass_type *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36 + 8);
        iVar6 = *(int32_t *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar36 + 0xc);
        puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36);
        local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_2b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x10);
        local_2b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_2b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x20);
        local_2b8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_2b8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)(pNVar11->val).m_backend.data._M_elems + lVar36 + 0x30);
        local_2b8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_2b8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_178.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_178.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_178.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_178.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_178.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_178.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_178.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_178.m_backend.exp = (eps->m_backend).exp;
        local_178.m_backend.neg = (eps->m_backend).neg;
        local_178.m_backend.fpclass = (eps->m_backend).fpclass;
        local_178.m_backend.prec_elem = (eps->m_backend).prec_elem;
        local_2b8.m_backend.exp = iVar35;
        local_2b8.m_backend.neg = (bool)uVar4;
        local_2b8.m_backend.fpclass = fVar5;
        local_2b8.m_backend.prec_elem = iVar6;
        bVar22 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_2b8,&local_178);
        if (bVar22) {
          iVar7 = *(int *)((long)(&pSVar12->m_elem->val + 1) + lVar36);
          (this->u).col.idx[local_478] = iVar7;
          lVar29 = (long)(this->u).row.len[iVar7] + (long)(this->u).row.start[iVar7];
          (this->u).row.idx[lVar29] = iVar26;
          pnVar13 = (this->u).row.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)(lVar29 * 0x50);
          puVar2 = (undefined8 *)
                   ((long)(pnVar25->m_backend).data._M_elems +
                   (long)((long)(pnVar13->m_backend).data._M_elems + 0x30U));
          *puVar2 = uVar20;
          puVar2[1] = uVar21;
          puVar2 = (undefined8 *)
                   ((long)(pnVar25->m_backend).data._M_elems +
                   (long)((long)(pnVar13->m_backend).data._M_elems + 0x20U));
          *puVar2 = uVar18;
          puVar2[1] = uVar19;
          puVar2 = (undefined8 *)
                   ((long)(pnVar25->m_backend).data._M_elems +
                   (long)((long)(pnVar13->m_backend).data._M_elems + 0x10U));
          *puVar2 = uVar16;
          puVar2[1] = uVar17;
          puVar2 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + (long)pnVar13);
          *puVar2 = uVar14;
          puVar2[1] = uVar15;
          *(int *)((long)(&(pnVar25->m_backend).data + 1) + (long)pnVar13) = iVar35;
          *(undefined1 *)
           ((long)(&(pnVar25->m_backend).data + 1) +
           (long)((long)(pnVar13->m_backend).data._M_elems + 4U)) = uVar4;
          *(fpclass_type *)
           ((long)(&(pnVar25->m_backend).data + 1) +
           (long)((long)(pnVar13->m_backend).data._M_elems + 8U)) = fVar5;
          *(int32_t *)
           ((long)(&(pnVar25->m_backend).data + 1) +
           (long)((long)(pnVar13->m_backend).data._M_elems + 0xcU)) = iVar6;
          piVar9 = (this->u).row.len + iVar7;
          *piVar9 = *piVar9 + 1;
          local_308 = uVar14;
          uStack_300 = uVar15;
          local_2f8 = uVar16;
          uStack_2f0 = uVar17;
          local_2e8 = uVar18;
          uStack_2e0 = uVar19;
          local_2d8 = uVar20;
          uStack_2d0 = uVar21;
          local_2c8 = iVar35;
          local_2c4 = uVar4;
          local_2c0 = fVar5;
          local_2bc = iVar6;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result,(multiprecision *)&local_308,pnVar25);
          tVar23 = boost::multiprecision::operator>(&result,this_00);
          if (tVar23) {
            local_358 = uVar14;
            uStack_350 = uVar15;
            local_348 = uVar16;
            uStack_340 = uVar17;
            local_338 = uVar18;
            uStack_330 = uVar19;
            local_328 = uVar20;
            uStack_320 = uVar21;
            local_318 = iVar35;
            local_314 = uVar4;
            local_310 = fVar5;
            local_30c = iVar6;
            boost::multiprecision::
            abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result,(multiprecision *)&local_358,arg);
            *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 0xc) =
                 result.m_backend.data._M_elems._48_8_;
            *(ulong *)((this->initMaxabs).m_backend.data._M_elems + 0xe) =
                 CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,
                          result.m_backend.data._M_elems._56_5_);
            *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 8) =
                 result.m_backend.data._M_elems._32_8_;
            *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 10) =
                 result.m_backend.data._M_elems._40_8_;
            *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 4) =
                 result.m_backend.data._M_elems._16_8_;
            *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 6) =
                 result.m_backend.data._M_elems._24_8_;
            *(undefined8 *)(this_00->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_
            ;
            *(undefined8 *)((this->initMaxabs).m_backend.data._M_elems + 2) =
                 result.m_backend.data._M_elems._8_8_;
            (this->initMaxabs).m_backend.exp = result.m_backend.exp;
            (this->initMaxabs).m_backend.neg = result.m_backend.neg;
            (this->initMaxabs).m_backend.fpclass = result.m_backend.fpclass;
            (this->initMaxabs).m_backend.prec_elem = result.m_backend.prec_elem;
          }
          local_478 = local_478 + 1;
          local_474 = local_474 + 1;
        }
        uVar24 = (ulong)(uint)pSVar12->memused;
        lVar36 = lVar36 + 0x54;
      }
    }
    (this->u).col.max[lVar31] = local_474;
    (this->u).col.len[lVar31] = local_474;
    (this->temp).s_cact[lVar31] = local_474;
    lVar31 = lVar31 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}